

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

bool API::checkDelete(STMT *stmt,int pos)

{
  _Rb_tree_color _Var1;
  int iVar2;
  int iVar3;
  TableInfo *pTVar4;
  pointer pbVar5;
  iterator iVar6;
  ostream *poVar7;
  long *plVar8;
  pointer pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  
  if (pos < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"delete fail,table ",0x12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(stmt->tableName)._M_dataplus._M_p,
                        (stmt->tableName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," does not exist",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
LAB_00119f45:
    bVar22 = false;
  }
  else {
    pcVar9 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar22 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
             super__Vector_impl_data._M_finish == pcVar9;
    if (!bVar22) {
      pTVar4 = CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[(uint)pos];
      lVar20 = 8;
      lVar12 = 0;
      uVar13 = 0;
      bVar21 = false;
      do {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&(pTVar4->getID)._M_t,
                       (key_type *)((long)&(pcVar9->colunmName)._M_dataplus._M_p + lVar12));
        if ((_Rb_tree_header *)iVar6._M_node == &(pTVar4->getID)._M_t._M_impl.super__Rb_tree_header)
        {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colunm ",7);
          pcVar9 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar10 = ((long)(stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pcVar9 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          if (uVar10 < uVar13 || uVar10 - uVar13 == 0) goto LAB_00119f56;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              *(char **)((long)&(pcVar9->colunmName)._M_dataplus._M_p + lVar12),
                              *(long *)((long)&(pcVar9->colunmName)._M_string_length + lVar12));
          lVar11 = 0xe;
          pcVar14 = "does not exist";
LAB_00119e5a:
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,lVar11);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          bVar22 = true;
        }
        else {
          pcVar9 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar10 = ((long)(stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pcVar9 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          if (uVar10 < uVar13 || uVar10 - uVar13 == 0) {
LAB_00119f56:
            pcVar14 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            lVar12 = **(long **)(pcVar14 + 0x40);
            lVar20 = (*(long **)(pcVar14 + 0x40))[1] - lVar12;
            if (lVar20 != 0) {
              lVar11 = (lVar20 >> 3) * 0x4ec4ec4ec4ec4ec5;
              lVar20 = *(long *)(uVar13 + 0xb0);
              lVar15 = uVar13 + 0xa8;
              lVar16 = 0;
              do {
                piVar17 = (int *)(lVar16 * 0x68 + lVar12);
                lVar18 = lVar15;
                if (lVar20 != 0) {
                  lVar19 = lVar20;
                  do {
                    if (*piVar17 <= *(int *)(lVar19 + 0x20)) {
                      lVar18 = lVar19;
                    }
                    lVar19 = *(long *)(lVar19 + 0x10 +
                                      (ulong)(*(int *)(lVar19 + 0x20) < *piVar17) * 8);
                  } while (lVar19 != 0);
                }
                lVar19 = lVar15;
                if ((lVar18 != lVar15) && (lVar19 = lVar18, *piVar17 < *(int *)(lVar18 + 0x20))) {
                  lVar19 = lVar15;
                }
                *(bool *)(piVar17 + 10) = lVar19 != lVar15;
                lVar16 = lVar16 + 1;
              } while (lVar16 != lVar11 + (ulong)(lVar11 == 0));
            }
            return true;
          }
          _Var1 = iVar6._M_node[2]._M_color;
          *(_Rb_tree_color *)((long)&pcVar9->colunmID + lVar12) = _Var1;
          iVar2 = *(int *)((long)&pcVar9->type + lVar12);
          iVar3 = (pTVar4->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)_Var1];
          if (iVar2 == iVar3) {
LAB_00119dd4:
            bVar22 = false;
            if (bVar21) {
              lVar11 = 0xd;
              poVar7 = (ostream *)&std::cout;
              pcVar14 = "error occured";
              goto LAB_00119e5a;
            }
          }
          else if (((iVar2 != iVar3 && iVar3 <= iVar2) || (iVar2 < 0x1d4c1)) ||
                  (bVar22 = false, iVar3 < 0x1d4c1)) {
            pbVar5 = (pTVar4->attributeName).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)((long)pbVar5 + lVar20 + -8),
                                *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar20));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," type does not match",0x14);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"insert type is ",0xf);
            poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," while check type is ",0x15);
            plVar8 = (long *)std::ostream::operator<<(poVar7,iVar3);
            std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
            std::ostream::put((char)plVar8);
            std::ostream::flush();
            bVar21 = true;
            goto LAB_00119dd4;
          }
        }
        if (bVar22) goto LAB_00119f45;
        uVar13 = uVar13 + 1;
        pcVar9 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar9 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        lVar12 = lVar12 + 0x68;
        lVar20 = lVar20 + 0x20;
        bVar23 = uVar10 - uVar13 == 0;
        bVar22 = uVar10 < uVar13 || bVar23;
      } while (uVar10 >= uVar13 && !bVar23);
    }
  }
  return bVar22;
}

Assistant:

bool API::checkDelete(STMT* stmt,int pos){
    if(pos < 0){
        std::cout<<"delete fail,table "<<stmt->tableName<<" does not exist"<<std::endl;
        return false;
    }
    TableInfo* info = CM.TableInfoList[pos];
    //增加id 增加类型检查
    bool error = false;
    for(int i = 0 ; i < stmt->c_list->size() ; i ++){
        //增加colunmid
        auto it = info->getID.find(stmt->c_list->at(i).colunmName);
        if(it==info->getID.end()){
            std::cout<<"colunm "<< stmt->c_list->at(i).colunmName << "does not exist"<<std::endl;
            return false;
        }
        else{
            stmt->c_list->at(i).colunmID = it->second;
        }
        //先检查类型
        int insertType = stmt->c_list->at(i).type;
        int checkType = info->type[it->second];
        if(insertType != checkType ){
            if(checkType > 120000 && insertType > 120000 && insertType <= checkType)continue;
            std::cout<<info->attributeName[i]<<" type does not match"<< std::endl;
            std::cout << "insert type is "<<insertType<<" while check type is "<<checkType<<std::endl;
            error = true;
        }
        if(error){
            std::cout<<"error occured"<<std::endl;
            return false;
        }
    }
    return true;
}